

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavaOPL3.hpp
# Opt level: O3

void __thiscall ADL_JavaOPL3::OPL3::updateChannelPans(OPL3 *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Channel *pCVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  
  lVar6 = 0;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    lVar7 = 0;
    do {
      this->registers[(long)this->channels[lVar6][lVar7]->channelBaseAddress + 0xc0] =
           this->registers[(long)this->channels[lVar6][lVar7]->channelBaseAddress + 0xc0] | 0xf0;
      if (this->FullPan == false) {
        pCVar3 = this->channels[lVar6][lVar7];
        dVar8 = 0.3333;
        dVar9 = 0.3333;
        if (this->_new != 0) {
          uVar1 = pCVar3->cha;
          uVar2 = pCVar3->chb;
          dVar8 = (double)(int)uVar1 * 0.3333;
          dVar9 = (double)(int)uVar2 * 0.3333;
        }
        pCVar3->leftPan = dVar8;
        pCVar3->rightPan = dVar9;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 9);
    lVar6 = 1;
    bVar4 = false;
  } while (bVar5);
  return;
}

Assistant:

void OPL3::updateChannelPans() {
    for(int array=0; array<2; array++)
        for(int i=0; i<9; i++) {
            int baseAddress = channels[array][i]->channelBaseAddress;
			registers[baseAddress+ChannelData::CHD1_CHC1_CHB1_CHA1_FB3_CNT1_Offset] |= 0xF0;
            channels[array][i]->updatePan(this);
        }

}